

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O0

boolean resists_blnd(monst *mon)

{
  permonst *ptr_00;
  boolean bVar1;
  attack *paVar2;
  bool bVar3;
  obj *local_40;
  obj *local_38;
  obj *local_30;
  obj *o;
  boolean is_you;
  permonst *ptr;
  monst *mon_local;
  
  ptr_00 = mon->data;
  bVar3 = mon != &youmonst;
  if (bVar3) {
    if (mon->mblinded != '\0') {
      return '\x01';
    }
    if ((*(uint *)&mon->field_0x60 >> 0x11 & 1) == 0) {
      return '\x01';
    }
    if ((ptr_00->mflags1 & 0x1000) != 0) {
      return '\x01';
    }
    if ((*(uint *)&mon->field_0x60 >> 0x13 & 1) != 0) {
      return '\x01';
    }
  }
  else if ((((u.uprops[0x1e].intrinsic != 0) ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) || (u.usleep != 0)) {
    return '\x01';
  }
  paVar2 = dmgtype_fromattack(ptr_00,0xb,0xd);
  if ((paVar2 == (attack *)0x0) &&
     (paVar2 = dmgtype_fromattack(ptr_00,0xb,0xf), paVar2 == (attack *)0x0)) {
    if (bVar3) {
      local_38 = mon->mw;
    }
    else {
      local_38 = uwep;
    }
    if (((local_38 == (obj *)0x0) || (local_38->oartifact == '\0')) ||
       (bVar1 = defends(0xb,local_38), bVar1 == '\0')) {
      if (bVar3) {
        local_40 = mon->minvent;
      }
      else {
        local_40 = invent;
      }
      for (local_30 = local_40; local_30 != (obj *)0x0; local_30 = local_30->nobj) {
        if ((local_30->oartifact != '\0') && (bVar1 = protects(0xb,local_30), bVar1 != '\0')) {
          return '\x01';
        }
      }
      mon_local._7_1_ = '\0';
    }
    else {
      mon_local._7_1_ = '\x01';
    }
  }
  else {
    mon_local._7_1_ = '\x01';
  }
  return mon_local._7_1_;
}

Assistant:

boolean resists_blnd(struct monst *mon)
{
	const struct permonst *ptr = mon->data;
	boolean is_you = (mon == &youmonst);
	struct obj *o;

	if (is_you ? (Blind || u.usleep) :
		(mon->mblinded || !mon->mcansee || !haseyes(ptr) ||
		    /* BUG: temporary sleep sets mfrozen, but since
			    paralysis does too, we can't check it */
		    mon->msleeping))
	    return TRUE;
	/* yellow light, Archon; !dust vortex, !cobra, !raven */
	if (dmgtype_fromattack(ptr, AD_BLND, AT_EXPL) ||
		dmgtype_fromattack(ptr, AD_BLND, AT_GAZE))
	    return TRUE;
	o = is_you ? uwep : MON_WEP(mon);
	if (o && o->oartifact && defends(AD_BLND, o))
	    return TRUE;
	o = is_you ? invent : mon->minvent;
	for ( ; o; o = o->nobj)
	    if (o->oartifact && protects(AD_BLND, o))
		return TRUE;
	return FALSE;
}